

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void __thiscall gimage::Polygon::reduce(Polygon *this,float tolerance)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  long *plVar4;
  double *pdVar5;
  long lVar6;
  vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_> *in_RDI;
  float in_XMM0_Da;
  double s;
  double extraout_XMM0_Qa;
  size_t j;
  double d;
  Vector2d N;
  bool remove;
  size_t k;
  size_t i;
  vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<const_gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
  *in_stack_ffffffffffffff10;
  __normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
  *in_stack_ffffffffffffff18;
  SVector<double,_2> *in_stack_ffffffffffffff20;
  vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
  *in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  ulong local_48;
  SVector<double,_2> local_38;
  byte local_21;
  ulong local_20;
  ulong local_18;
  float local_c;
  
  local_18 = 0;
  local_20 = 1;
  local_c = in_XMM0_Da;
  do {
    uVar1 = local_18 + 1;
    sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                      (in_RDI);
    if (sVar2 <= uVar1) {
      return;
    }
    local_21 = 1;
    uVar1 = local_20 + 1;
    sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                      (in_RDI);
    if (uVar1 < sVar2) {
      gmath::SVector<double,_2>::SVector(&local_38);
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_20 + 1);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,1);
      in_stack_ffffffffffffff28 =
           (vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_> *)*plVar4;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_18);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,1);
      in_stack_ffffffffffffff30._M_current =
           (SVector<long,_2> *)(double)((long)in_stack_ffffffffffffff28 - *plVar4);
      pdVar5 = gmath::SVector<double,_2>::operator[](&local_38,0);
      *pdVar5 = (double)in_stack_ffffffffffffff30._M_current;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_18);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
      in_stack_ffffffffffffff38._M_current = (SVector<long,_2> *)*plVar4;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_20 + 1);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
      lVar6 = (long)in_stack_ffffffffffffff38._M_current - *plVar4;
      pdVar5 = gmath::SVector<double,_2>::operator[](&local_38,1);
      *pdVar5 = (double)lVar6;
      s = gmath::norm<double,2>(in_stack_ffffffffffffff20);
      gmath::SVector<double,_2>::operator/=(&local_38,s);
      gmath::SVector<double,_2>::operator[](&local_38,0);
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_18);
      gmath::SVector<long,_2>::operator[](pvVar3,0);
      gmath::SVector<double,_2>::operator[](&local_38,1);
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_18);
      gmath::SVector<long,_2>::operator[](pvVar3,1);
      local_21 = 0;
      local_48 = local_18;
      do {
        local_48 = local_48 + 1;
        if (local_20 < local_48) goto LAB_001988c2;
        pdVar5 = gmath::SVector<double,_2>::operator[](&local_38,0);
        in_stack_ffffffffffffff18 =
             (__normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
              *)*pdVar5;
        pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
                 operator[](in_RDI,local_48);
        plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
        in_stack_ffffffffffffff20 = (SVector<double,_2> *)(double)*plVar4;
        pdVar5 = gmath::SVector<double,_2>::operator[](&local_38,1);
        in_stack_ffffffffffffff10 =
             (__normal_iterator<const_gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
              *)*pdVar5;
        pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
                 operator[](in_RDI,local_48);
        gmath::SVector<long,_2>::operator[](pvVar3,1);
        std::abs((int)pvVar3);
      } while (extraout_XMM0_Qa <= (double)local_c);
      local_21 = 1;
    }
LAB_001988c2:
    if ((local_21 & 1) == 0) {
      local_20 = local_20 + 1;
    }
    else {
      std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::begin
                (in_stack_ffffffffffffff08);
      __gnu_cxx::
      __normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
      ::operator+(in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
      ::operator+(in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<gmath::SVector<long,2>const*,std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>>
      ::__normal_iterator<gmath::SVector<long,2>*>
                (in_stack_ffffffffffffff10,
                 (__normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
                  *)in_stack_ffffffffffffff08);
      std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::begin
                (in_stack_ffffffffffffff08);
      __gnu_cxx::
      __normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
      ::operator+(in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
      __gnu_cxx::
      __normal_iterator<gmath::SVector<long,2>const*,std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>>
      ::__normal_iterator<gmath::SVector<long,2>*>
                (in_stack_ffffffffffffff10,
                 (__normal_iterator<gmath::SVector<long,_2>_*,_std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>_>
                  *)in_stack_ffffffffffffff08);
      std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::erase
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      local_20 = local_18 + 2;
      local_18 = local_18 + 1;
    }
  } while( true );
}

Assistant:

void Polygon::reduce(float tolerance)
{
  size_t i=0;
  size_t k=1;

  while (i+1 < vertex.size())
  {
    // test if linear piece can be extended by one

    bool remove=true;
    if (k+1 < vertex.size())
    {
      // get line between vertex i and k+1 in Hesse normal form

      gmath::Vector2d N;
      N[0]=vertex[k+1][1]-vertex[i][1];
      N[1]=vertex[i][0]-vertex[k+1][0];
      N/=norm(N);

      double d=N[0]*vertex[i][0]+N[1]*vertex[i][1];

      // check if distance of vertices in between i and k+1 exceed tolerance

      remove=false;
      for (size_t j=i+1; j<=k; j++)
      {
        if (std::abs(N[0]*vertex[j][0]+N[1]*vertex[j][1]-d) > tolerance)
        {
          remove=true;
          break;
        }
      }
    }

    // remove all vertices between i and k

    if (remove)
    {
      vertex.erase(vertex.begin()+i+1, vertex.begin()+k);

      i++;
      k=i+1;
    }
    else
    {
      k++;
    }
  }
}